

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Base.cpp
# Opt level: O3

string * __thiscall mbc::Val::ValBase::str_abi_cxx11_(string *__return_storage_ptr__,ValBase *this)

{
  string *psVar1;
  pointer pcVar2;
  
  if (*this->is_vaild_ == true) {
    (*this->_vptr_ValBase[3])(__return_storage_ptr__);
  }
  else {
    psVar1 = this->invaild_waring_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar1->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

const string ValBase::str() const {
    if (*is_vaild_) {
        return str_();
    } else {
        return *invaild_waring_;
    }
}